

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

pair<ska::detailv3::sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>::templated_iterator<slang::SVInt>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
::emplace_new_key<slang::SVInt>
          (sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
           *this,int8_t distance_from_desired,EntryPointer current_entry,SVInt *key)

{
  anon_union_16_1_a8c68091_for_sherwood_v3_entry<slang::SVInt>_3 *paVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar6;
  long lVar7;
  EntryPointer psVar8;
  undefined7 uVar10;
  ulong uVar9;
  char cVar11;
  char __tmp;
  int8_t iVar12;
  char cVar13;
  EntryPointer psVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  pair<ska::detailv3::sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>::templated_iterator<slang::SVInt>,_bool>
  pVar17;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_58;
  uint local_50;
  undefined1 local_4c;
  byte local_4b;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_48;
  uint local_40;
  undefined1 local_3c;
  byte local_3b;
  anon_union_16_1_a8c68091_for_sherwood_v3_entry<slang::SVInt>_3 *local_38;
  
  if ((this->num_slots_minus_one != 0) && (this->max_lookups != distance_from_desired)) {
    lVar7 = this->num_elements + 1;
    auVar15._8_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar15._0_8_ = lVar7;
    auVar15._12_4_ = 0x45300000;
    lVar5 = this->num_slots_minus_one + 1;
    auVar16._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar16._0_8_ = lVar5;
    auVar16._12_4_ = 0x45300000;
    if ((auVar15._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0) <=
        (double)this->_max_load_factor *
        ((auVar16._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0))) {
      iVar12 = current_entry->distance_from_desired;
      uVar10 = (undefined7)((ulong)this >> 8);
      if (iVar12 < '\0') {
        uVar4 = (key->super_SVIntStorage).bitWidth;
        bVar2 = (key->super_SVIntStorage).signFlag;
        bVar3 = (key->super_SVIntStorage).unknownFlag;
        (current_entry->field_1).value.super_SVIntStorage.field_0.val = 0;
        *(uint *)((long)&current_entry->field_1 + 8) = uVar4;
        *(bool *)((long)&current_entry->field_1 + 0xc) = bVar2;
        *(bool *)((long)&current_entry->field_1 + 0xd) = bVar3;
        if (uVar4 < 0x41 && (bVar3 & 1U) == 0) {
          aVar6 = (key->super_SVIntStorage).field_0;
        }
        else {
          aVar6 = (key->super_SVIntStorage).field_0;
          (key->super_SVIntStorage).field_0.val = 0;
        }
        (current_entry->field_1).value.super_SVIntStorage.field_0 = aVar6;
        current_entry->distance_from_desired = distance_from_desired;
        this->num_elements = this->num_elements + 1;
        uVar9 = CONCAT71(uVar10,1);
      }
      else {
        local_50 = (key->super_SVIntStorage).bitWidth;
        local_4c = (key->super_SVIntStorage).signFlag;
        local_4b = (key->super_SVIntStorage).unknownFlag;
        if (local_50 < 0x41 && (local_4b & 1) == 0) {
          local_48 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)
                     (key->super_SVIntStorage).field_0.pVal;
          current_entry->distance_from_desired = distance_from_desired;
          local_58 = local_48;
        }
        else {
          local_48 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)
                     (key->super_SVIntStorage).field_0.pVal;
          (key->super_SVIntStorage).field_0.val = 0;
          iVar12 = current_entry->distance_from_desired;
          current_entry->distance_from_desired = distance_from_desired;
          local_58.val = 0;
        }
        paVar1 = &current_entry->field_1;
        local_40 = local_50;
        local_3c = local_4c;
        local_3b = local_4b;
        slang::SVInt::operator=((SVInt *)&local_58,&paVar1->value);
        local_38 = paVar1;
        slang::SVInt::operator=(&paVar1->value,(SVInt *)&local_48);
        if (((0x40 < local_40) || ((local_3b & 1) != 0)) &&
           ((uint64_t *)local_48.val != (uint64_t *)0x0)) {
          operator_delete__(local_48.pVal);
        }
        cVar13 = iVar12 + '\x01';
        psVar14 = current_entry + 1;
        cVar11 = current_entry[1].distance_from_desired;
        psVar8 = current_entry;
        if (-1 < cVar11) {
          do {
            psVar8 = psVar14;
            paVar1 = local_38;
            aVar6 = local_58;
            if (cVar11 < cVar13) {
              psVar8->distance_from_desired = cVar13;
              local_40 = local_50;
              local_3c = local_4c;
              local_3b = local_4b;
              if (0x40 < local_50 || (local_4b & 1) != 0) {
                local_58.val = 0;
              }
              local_48.val = aVar6.val;
              slang::SVInt::operator=((SVInt *)&local_58,&(psVar8->field_1).value);
              slang::SVInt::operator=(&(psVar8->field_1).value,(SVInt *)&local_48);
              if (((0x40 < local_40) || ((local_3b & 1) != 0)) &&
                 ((uint64_t *)local_48.val != (uint64_t *)0x0)) {
                operator_delete__(local_48.pVal);
              }
              cVar13 = cVar11 + '\x01';
            }
            else {
              cVar13 = cVar13 + '\x01';
              if (cVar13 == this->max_lookups) {
                local_40 = local_50;
                local_3c = local_4c;
                local_3b = local_4b;
                if (0x40 < local_50 || (local_4b & 1) != 0) {
                  local_58.val = 0;
                }
                local_48.val = aVar6.val;
                slang::SVInt::operator=((SVInt *)&local_58,&local_38->value);
                slang::SVInt::operator=(&paVar1->value,(SVInt *)&local_48);
                if (((0x40 < local_40) || ((local_3b & 1) != 0)) &&
                   ((uint64_t *)local_48.val != (uint64_t *)0x0)) {
                  operator_delete__(local_48.pVal);
                }
                grow(this);
                pVar17 = emplace<slang::SVInt>(this,(SVInt *)&local_58);
                current_entry = (EntryPointer)pVar17.first.current;
                uVar9 = (ulong)pVar17._8_4_;
                goto LAB_001c2b14;
              }
            }
            cVar11 = psVar8[1].distance_from_desired;
            psVar14 = psVar8 + 1;
          } while (-1 < cVar11);
        }
        aVar6 = local_58;
        psVar8[1].field_1.value.super_SVIntStorage.field_0.val = 0;
        *(uint *)((long)&psVar8[1].field_1 + 8) = local_50;
        *(undefined1 *)((long)&psVar8[1].field_1 + 0xc) = local_4c;
        *(byte *)((long)&psVar8[1].field_1 + 0xd) = local_4b;
        if (0x40 < local_50 || (local_4b & 1) != 0) {
          local_58.val = 0;
        }
        psVar8[1].field_1.value.super_SVIntStorage.field_0.pVal = (uint64_t *)aVar6;
        psVar14->distance_from_desired = cVar13;
        this->num_elements = this->num_elements + 1;
        uVar9 = CONCAT71(uVar10,1);
LAB_001c2b14:
        if (((0x40 < local_50) || ((local_4b & 1) != 0)) &&
           ((uint64_t *)local_58.val != (uint64_t *)0x0)) {
          operator_delete__(local_58.pVal);
        }
      }
      goto LAB_001c2855;
    }
  }
  grow(this);
  pVar17 = emplace<slang::SVInt>(this,key);
  current_entry = (EntryPointer)pVar17.first.current;
  uVar9 = (ulong)pVar17._8_4_;
LAB_001c2855:
  pVar17._8_8_ = uVar9 & 0xffffffff;
  pVar17.first.current = current_entry;
  return pVar17;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }